

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolui.c
# Opt level: O2

int ffg3dui(fitsfile *fptr,long group,unsigned_short nulval,LONGLONG ncols,LONGLONG nrows,
           LONGLONG naxis1,LONGLONG naxis2,LONGLONG naxis3,unsigned_short *array,int *anynul,
           int *status)

{
  int iVar1;
  long lVar2;
  unsigned_short *array_00;
  LONGLONG firstelem;
  long lVar3;
  long lVar4;
  bool bVar5;
  unsigned_short nullvalue;
  long local_b8;
  long local_b0;
  long local_a8;
  LONGLONG local_a0;
  long local_98;
  ulong local_90;
  char cdummy;
  LONGLONG local_80;
  LONGLONG local_78;
  LONGLONG fpixel [3];
  long inc [3];
  
  inc[0] = 1;
  inc[1] = 1;
  firstelem = 1;
  inc[2] = 1;
  fpixel[0] = 1;
  fpixel[1] = 1;
  fpixel[2] = 1;
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    if (group < 2) {
      group = firstelem;
    }
    if (nrows != naxis2 || ncols != naxis1) {
      if (nrows < naxis2 || ncols < naxis1) {
        *status = 0x140;
        return 0x140;
      }
      local_a8 = (nrows - naxis2) * ncols;
      lVar2 = 0;
      local_b0 = naxis2;
      if (naxis2 < 1) {
        local_b0 = lVar2;
      }
      local_b8 = naxis3;
      if (naxis3 < 1) {
        local_b8 = lVar2;
      }
      local_98 = ncols * 2;
      local_90 = (ulong)nulval;
      lVar4 = 0;
      local_a0 = group;
      for (; lVar2 != local_b8; lVar2 = lVar2 + 1) {
        array_00 = array + lVar4;
        lVar4 = lVar4 + local_a8;
        lVar3 = local_b0;
        while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, bVar5) {
          iVar1 = ffgclui(fptr,2,group,firstelem,naxis1,1,1,(unsigned_short)local_90,array_00,
                          &cdummy,anynul,status);
          if (0 < iVar1) goto LAB_0019c1fa;
          firstelem = firstelem + naxis1;
          lVar4 = lVar4 + ncols;
          array_00 = (unsigned_short *)((long)array_00 + local_98);
          group = local_a0;
        }
      }
LAB_0019c1fa:
      return *status;
    }
    ffgclui(fptr,2,group,1,nrows * ncols * naxis3,1,1,nulval,array,&cdummy,anynul,status);
  }
  else {
    local_78 = naxis3;
    nullvalue = nulval;
    _cdummy = ncols;
    local_80 = nrows;
    fits_read_compressed_img
              (fptr,0x14,fpixel,(LONGLONG *)&cdummy,inc,1,&nullvalue,array,(char *)0x0,anynul,status
              );
  }
  return *status;
}

Assistant:

int ffg3dui(fitsfile *fptr,  /* I - FITS file pointer                       */
           long  group,     /* I - group to read (1 = 1st group)           */
  unsigned short nulval,    /* set undefined pixels equal to this          */
           LONGLONG  ncols,     /* I - number of pixels in each row of array   */
           LONGLONG  nrows,     /* I - number of rows in each plane of array   */
           LONGLONG  naxis1,    /* I - FITS image NAXIS1 value                 */
           LONGLONG  naxis2,    /* I - FITS image NAXIS2 value                 */
           LONGLONG  naxis3,    /* I - FITS image NAXIS3 value                 */
  unsigned short *array,    /* O - array to be filled and returned         */
           int  *anynul,    /* O - set to 1 if any values are null; else 0 */
           int  *status)    /* IO - error status                           */
/*
  Read an entire 3-D array of values to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of the
  FITS array is not the same as the array being read).  Any null
  values in the array will be set equal to the value of nulval, unless
  nulval = 0 in which case no null checking will be performed.
*/
{
    long tablerow, ii, jj;
    char cdummy;
    int nullcheck = 1;
    long inc[] = {1,1,1};
    LONGLONG fpixel[] = {1,1,1}, nfits, narray;
    LONGLONG lpixel[3];
    unsigned short nullvalue;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        lpixel[0] = ncols;
        lpixel[1] = nrows;
        lpixel[2] = naxis3;
        nullvalue = nulval;  /* set local variable */

        fits_read_compressed_img(fptr, TUSHORT, fpixel, lpixel, inc,
            nullcheck, &nullvalue, array, NULL, anynul, status);
        return(*status);
    }

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */
    tablerow=maxvalue(1,group);

    if (ncols == naxis1 && nrows == naxis2)  /* arrays have same size? */
    {
       /* all the image pixels are contiguous, so read all at once */
       ffgclui(fptr, 2, tablerow, 1, naxis1 * naxis2 * naxis3, 1, 1, nulval,
               array, &cdummy, anynul, status);
       return(*status);
    }

    if (ncols < naxis1 || nrows < naxis2)
       return(*status = BAD_DIMEN);

    nfits = 1;   /* next pixel in FITS image to read */
    narray = 0;  /* next pixel in output array to be filled */

    /* loop over naxis3 planes in the data cube */
    for (jj = 0; jj < naxis3; jj++)
    {
      /* loop over the naxis2 rows in the FITS image, */
      /* reading naxis1 pixels to each row            */

      for (ii = 0; ii < naxis2; ii++)
      {
       if (ffgclui(fptr, 2, tablerow, nfits, naxis1, 1, 1, nulval,
          &array[narray], &cdummy, anynul, status) > 0)
          return(*status);

       nfits += naxis1;
       narray += ncols;
      }
      narray += (nrows - naxis2) * ncols;
    }

    return(*status);
}